

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::pixelThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
               Surface *result,RGBA *threshold,CompareLogMode logMode)

{
  bool bVar1;
  RGBA local_a8 [4];
  UVec4 local_98;
  ConstPixelBufferAccess local_88;
  ConstPixelBufferAccess local_60;
  RGBA *local_38;
  RGBA *threshold_local;
  Surface *result_local;
  Surface *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  local_38 = threshold;
  threshold_local = (RGBA *)result;
  result_local = reference;
  reference_local = (Surface *)imageSetDesc;
  imageSetDesc_local = imageSetName;
  imageSetName_local = (char *)log;
  Surface::getAccess(&local_60,reference);
  Surface::getAccess(&local_88,(Surface *)threshold_local);
  RGBA::toIVec(local_a8);
  Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&local_98);
  bVar1 = intThresholdCompare(log,imageSetName,imageSetDesc,&local_60,&local_88,&local_98,logMode);
  return bVar1;
}

Assistant:

bool pixelThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, const RGBA& threshold, CompareLogMode logMode)
{
	return intThresholdCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold.toIVec().cast<deUint32>(), logMode);
}